

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void expand_cmp_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   uint32_t bofs,uint32_t oprsz,uint32_t tysz,TCGType_conflict type,TCGCond cond)

{
  TCGv_vec r;
  TCGv_vec r_00;
  uint uVar1;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + tysz) {
    tcg_gen_ld_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
    tcg_gen_ld_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)(bofs + uVar1));
    tcg_gen_cmp_vec_tricore(tcg_ctx,cond,vece,r,r,r_00);
    tcg_gen_st_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(dofs + uVar1));
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_cmp_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                           uint32_t bofs, uint32_t oprsz, uint32_t tysz,
                           TCGType type, TCGCond cond)
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_cmp_vec(tcg_ctx, cond, vece, t0, t0, t1);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t1);
    tcg_temp_free_vec(tcg_ctx, t0);
}